

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_linkage_test.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  allocator<char> local_449;
  string local_448;
  shared_ptr<chaiscript::detail::Exception_Handler_Base> local_428;
  allocator<char> local_411;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  _func_int_int *local_3c8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_3c0;
  vector<chaiscript::Options,_std::allocator<chaiscript::Options>_> local_3b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_398;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378 [2];
  unique_ptr<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
  local_348;
  ModulePtr local_340;
  undefined1 local_330 [8];
  ChaiScript_Basic chai;
  
  chai.m_namespace_generators._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  create_chaiscript_stdlib();
  create_chaiscript_parser();
  local_378[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_378[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_378);
  local_398.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_398.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_398.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_398);
  chaiscript::default_options();
  chaiscript::ChaiScript_Basic::ChaiScript_Basic
            ((ChaiScript_Basic *)local_330,&local_340,&local_348,local_378,&local_398,&local_3b0);
  std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>::~vector(&local_3b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_398);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_378);
  std::
  unique_ptr<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
  ::~unique_ptr(&local_348);
  std::shared_ptr<chaiscript::Module>::~shared_ptr(&local_340);
  local_3c8 = do_something;
  chaiscript::fun<int(*)(int)>((chaiscript *)&local_3c0,&local_3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"do_something",&local_3e9)
  ;
  chaiscript::ChaiScript_Basic::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            ((ChaiScript_Basic *)local_330,&local_3c0,&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_3c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"do_something(101)",&local_411);
  std::shared_ptr<chaiscript::detail::Exception_Handler_Base>::shared_ptr(&local_428);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_448,"__EVAL__",&local_449);
  iVar1 = chaiscript::ChaiScript_Basic::eval<int>
                    ((ChaiScript_Basic *)local_330,&local_410,&local_428,&local_448);
  chai.m_namespace_generators._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       (uint)(iVar1 != 1);
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator(&local_449);
  std::shared_ptr<chaiscript::detail::Exception_Handler_Base>::~shared_ptr(&local_428);
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator(&local_411);
  chaiscript::ChaiScript_Basic::~ChaiScript_Basic((ChaiScript_Basic *)local_330);
  return chai.m_namespace_generators._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
}

Assistant:

int main() {
  chaiscript::ChaiScript_Basic chai(create_chaiscript_stdlib(), create_chaiscript_parser());
  chai.add(chaiscript::fun(&do_something), "do_something");

  return chai.eval<int>("do_something(101)") == 101 % 2 ? EXIT_SUCCESS : EXIT_FAILURE;
}